

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiterable.h
# Opt level: O2

QConstIterator<QMetaSequence> __thiscall
QIterable<QMetaSequence>::constEnd(QIterable<QMetaSequence> *this)

{
  void *pvVar1;
  void *extraout_RDX;
  long in_RSI;
  QConstIterator<QMetaSequence> QVar2;
  
  pvVar1 = QMetaContainer::constEnd
                     ((QMetaContainer *)(in_RSI + 0x10),
                      (void *)(*(ulong *)(in_RSI + 8) & 0xfffffffffffffffe));
  *(long *)this = in_RSI;
  (this->m_iterable).m_pointer.d = (quintptr)pvVar1;
  QVar2.super_QBaseIterator<QMetaSequence>.m_iterator = extraout_RDX;
  QVar2.super_QBaseIterator<QMetaSequence>.m_iterable.m_pointer.d =
       (QTaggedPointer<QIterable<QMetaSequence>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaSequence>,_QIterable<QMetaSequence>_>::Tag>
        )(QTaggedPointer<QIterable<QMetaSequence>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaSequence>,_QIterable<QMetaSequence>_>::Tag>
          )this;
  return (QConstIterator<QMetaSequence>)QVar2.super_QBaseIterator<QMetaSequence>;
}

Assistant:

QConstIterator<Container> constEnd() const
    {
        return QConstIterator(this, m_metaContainer.constEnd(constIterable()));
    }